

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O3

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::expectCancel(TestMoreStuffImpl *this,ExpectCancelContext context)

{
  long *plVar1;
  int iVar2;
  undefined8 *in_RDX;
  bool bVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  Own<capnp::ClientHook,_std::nullptr_t> OVar8;
  pointer_____offset_0x10___ *local_b0;
  undefined8 *local_a8;
  long *local_a0;
  PointerReader local_98;
  PointerReader local_78;
  StructReader local_58;
  
  (**(code **)*in_RDX)(&local_78);
  local_98.pointer = local_78.pointer;
  local_98.nestingLimit = local_78.nestingLimit;
  local_98._28_4_ = local_78._28_4_;
  local_98.segment = local_78.segment;
  local_98.capTable = local_78.capTable;
  PointerReader::getStruct(&local_58,&local_98,(word *)0x0);
  bVar3 = local_58.pointerCount != 0;
  local_98.pointer = (WirePointer *)0x0;
  if (bVar3) {
    local_98.pointer = local_58.pointers;
  }
  iVar2 = 0x7fffffff;
  if (bVar3) {
    iVar2 = local_58.nestingLimit;
  }
  uVar4 = 0;
  uVar5 = 0;
  uVar6 = 0;
  uVar7 = 0;
  if (bVar3) {
    uVar4 = local_58.segment._0_4_;
    uVar5 = local_58.segment._4_4_;
    uVar6 = local_58.capTable._0_4_;
    uVar7 = local_58.capTable._4_4_;
  }
  local_98.segment = (SegmentReader *)CONCAT44(uVar5,uVar4);
  local_98.capTable = (CapTableReader *)CONCAT44(uVar7,uVar6);
  local_98.nestingLimit = iVar2;
  OVar8 = PointerReader::getCapability(&local_78);
  (*(local_78.capTable)->_vptr_CapTableReader[4])(&local_a8,local_78.capTable,OVar8.ptr);
  local_b0 = &Capability::Client::typeinfo;
  loop(this,(uint)context.hook,(Client *)0x0,(CallContextHook *)&local_b0);
  plVar1 = local_a0;
  if (local_a0 != (long *)0x0) {
    local_a0 = (long *)0x0;
    (**(code **)*local_a8)(local_a8,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  (*(code *)(local_78.segment)->arena->_vptr_Arena)
            (local_78.segment,
             (local_78.capTable)->_vptr_CapTableReader[-2] +
             (long)&(local_78.capTable)->_vptr_CapTableReader);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::expectCancel(ExpectCancelContext context) {
  auto cap = context.getParams().getCap();
  return loop(0, cap, context);
}